

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cc
# Opt level: O0

int main(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  TerminalExpression *pTVar4;
  NonTerminalExpression *this;
  NonTerminalExpression *this_00;
  NonTerminalExpression *this_01;
  bool exper3;
  bool exper2;
  bool exper1;
  AbstractExpression *dog_and_dog;
  AbstractExpression *cat_and_dog;
  AbstractExpression *cat_and_cat;
  string local_100 [32];
  TerminalExpression *local_e0;
  AbstractExpression *dog;
  string local_d0 [32];
  TerminalExpression *local_b0;
  AbstractExpression *cat;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  Context context;
  
  context.vars._M_h._M_single_bucket._4_4_ = 0;
  Context::Context((Context *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"CAT",&local_69);
  Context::set((Context *)local_48,(string *)local_68,false);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"DOG",(allocator *)((long)&cat + 7));
  Context::set((Context *)local_48,(string *)local_a0,true);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cat + 7));
  pTVar4 = (TerminalExpression *)operator_new(0x28);
  dog._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"CAT",(allocator *)((long)&dog + 7));
  TerminalExpression::TerminalExpression(pTVar4,(string *)local_d0);
  dog._6_1_ = 0;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dog + 7));
  local_b0 = pTVar4;
  pTVar4 = (TerminalExpression *)operator_new(0x28);
  cat_and_cat._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"DOG",(allocator *)((long)&cat_and_cat + 7));
  TerminalExpression::TerminalExpression(pTVar4,(string *)local_100);
  cat_and_cat._6_1_ = 0;
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cat_and_cat + 7));
  local_e0 = pTVar4;
  this = (NonTerminalExpression *)operator_new(0x18);
  NonTerminalExpression::NonTerminalExpression
            (this,&local_b0->super_AbstractExpression,&local_b0->super_AbstractExpression);
  this_00 = (NonTerminalExpression *)operator_new(0x18);
  NonTerminalExpression::NonTerminalExpression
            (this_00,&local_b0->super_AbstractExpression,&local_e0->super_AbstractExpression);
  this_01 = (NonTerminalExpression *)operator_new(0x18);
  NonTerminalExpression::NonTerminalExpression
            (this_01,&local_e0->super_AbstractExpression,&local_e0->super_AbstractExpression);
  uVar1 = (**(this->super_AbstractExpression)._vptr_AbstractExpression)(this,local_48);
  uVar2 = (**(this_00->super_AbstractExpression)._vptr_AbstractExpression)(this_00,local_48);
  iVar3 = (**(this_01->super_AbstractExpression)._vptr_AbstractExpression)(this_01,local_48);
  if ((uVar1 & 1) != 0) {
    __assert_fail("exper1 == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/interpreter_test.cc"
                  ,0x16,"int main()");
  }
  if ((uVar2 & 1) == 0) {
    if (((byte)iVar3 & 1) == 1) {
      Context::~Context((Context *)local_48);
      return context.vars._M_h._M_single_bucket._4_4_;
    }
    __assert_fail("exper3 == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/interpreter_test.cc"
                  ,0x18,"int main()");
  }
  __assert_fail("exper2 == false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/interpreter_test.cc"
                ,0x17,"int main()");
}

Assistant:

int main() {
  Context context;

  context.set("CAT", false);
  context.set("DOG", true);

  AbstractExpression *cat = new TerminalExpression("CAT");
  AbstractExpression *dog = new TerminalExpression("DOG");
  AbstractExpression *cat_and_cat = new NonTerminalExpression(cat, cat);
  AbstractExpression *cat_and_dog = new NonTerminalExpression(cat, dog);
  AbstractExpression *dog_and_dog = new NonTerminalExpression(dog, dog);

  bool exper1 = cat_and_cat->interpret(&context);
  bool exper2 = cat_and_dog->interpret(&context);
  bool exper3 = dog_and_dog->interpret(&context);
  assert(exper1 == false);
  assert(exper2 == false);
  assert(exper3 == true);
}